

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsysteminterface.cpp
# Opt level: O2

bool QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::
     handleEvent<QWindowSystemInterfacePrivate::WindowStateChangedEvent,QWindow*,QFlags<Qt::WindowState>,QFlags<Qt::WindowState>>
               (QWindow *args,QFlags<Qt::WindowState> args_1,QFlags<Qt::WindowState> args_2)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  undefined1 uVar4;
  long in_FS_OFFSET;
  WindowStateChangedEvent event;
  undefined1 local_58 [16];
  undefined1 *local_48;
  Data *pDStack_40;
  QObject *local_38;
  undefined1 *puStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = QThread::isMainThread();
  if (cVar1 == '\0') {
    QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::
    handleEvent<QWindowSystemInterfacePrivate::WindowStateChangedEvent,QWindow*,QFlags<Qt::WindowState>,QFlags<Qt::WindowState>>
              (args,args_1,args_2);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      bVar2 = QWindowSystemInterface::flushWindowSystemEvents((ProcessEventsFlags)0x0);
      return bVar2;
    }
    goto LAB_002fca71;
  }
  local_38 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  pDStack_40 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QWindowSystemInterfacePrivate::WindowStateChangedEvent::WindowStateChangedEvent
            ((WindowStateChangedEvent *)local_58,args,
             (WindowStates)
             args_1.super_QFlagsStorageHelper<Qt::WindowState,_4>.
             super_QFlagsStorage<Qt::WindowState>.i,
             (WindowStates)
             args_2.super_QFlagsStorageHelper<Qt::WindowState,_4>.
             super_QFlagsStorage<Qt::WindowState>.i);
  if (QWindowSystemInterfacePrivate::eventHandler == (QWindowSystemEventHandler *)0x0) {
    QGuiApplicationPrivate::processWindowSystemEvent((WindowSystemEvent *)local_58);
LAB_002fca4a:
    uVar4 = local_48._0_1_;
  }
  else {
    iVar3 = (*QWindowSystemInterfacePrivate::eventHandler->_vptr_QWindowSystemEventHandler[2])
                      (QWindowSystemInterfacePrivate::eventHandler,local_58);
    if ((char)iVar3 != '\0') goto LAB_002fca4a;
    uVar4 = 0;
  }
  QWindowSystemInterfacePrivate::WindowStateChangedEvent::~WindowStateChangedEvent
            ((WindowStateChangedEvent *)local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (bool)uVar4;
  }
LAB_002fca71:
  __stack_chk_fail();
}

Assistant:

bool QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::handleEvent(Args ...args)
{
    if (QThread::isMainThread()) {
        EventType event(args...);
        // Process the event immediately on the Gui thread and return the accepted state
        if (QWindowSystemInterfacePrivate::eventHandler) {
            if (!QWindowSystemInterfacePrivate::eventHandler->sendEvent(&event))
                return false;
        } else {
            QGuiApplicationPrivate::processWindowSystemEvent(&event);
        }
        return event.eventAccepted;
    } else {
        // Post the event on the Qt main thread queue and flush the queue.
        // This will wake up the Gui thread which will process the event.
        // Return the accepted state for the last event on the queue,
        // which is the event posted by this function.
        QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::handleEvent<EventType>(args...);
        return QWindowSystemInterface::flushWindowSystemEvents();
    }
}